

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

void ON_RenderContentPrivate::SetRenderContentNodeRecursive(ON_RenderContent *rc,ON_XMLNode *node)

{
  ON_RenderContentPrivate *pOVar1;
  int iVar2;
  ON_UUID *uuid;
  ON_XMLNode *this;
  undefined4 extraout_var;
  ON_RenderContent *rc_00;
  ON_RenderContent *child_rc;
  ChildIterator it;
  ON_XMLNode *child_node;
  undefined1 local_118 [256];
  ON_XMLNode *local_18;
  ON_XMLNode *node_local;
  ON_RenderContent *rc_local;
  
  pOVar1 = rc->_private;
  local_18 = node;
  node_local = (ON_XMLNode *)rc;
  ON_ModelComponent::Name((ON_ModelComponent *)local_118);
  ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)(local_118 + 8),(ON_wString *)local_118);
  SetPropertyValue(pOVar1,L"instance-name",(ON_XMLVariant *)(local_118 + 8));
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)(local_118 + 8));
  ON_wString::~ON_wString((ON_wString *)local_118);
  pOVar1 = *(ON_RenderContentPrivate **)(node_local->_PRIVATE + 0x80);
  uuid = ON_ModelComponent::Id((ON_ModelComponent *)node_local);
  ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)&child_node,uuid);
  SetPropertyValue(pOVar1,L"instance-id",(ON_XMLVariant *)&child_node);
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&child_node);
  this = (ON_XMLNode *)operator_new(0xe8);
  iVar2 = (*node_local->_vptr_ON_XMLNode[0x46])();
  ON_XMLNode::ON_XMLNode(this,(ON_XMLNode *)CONCAT44(extraout_var,iVar2));
  it._private = (ON_RenderContentChildIteratorPrivate *)this;
  (*local_18->_vptr_ON_XMLNode[0xb])(local_18,this);
  (*node_local->_vptr_ON_XMLNode[0x2f])(&child_rc);
  while( true ) {
    rc_00 = ON_RenderContent::ChildIterator::GetNextChild((ChildIterator *)&child_rc);
    if (rc_00 == (ON_RenderContent *)0x0) break;
    SetRenderContentNodeRecursive(rc_00,(ON_XMLNode *)it._private);
  }
  ON_RenderContent::ChildIterator::~ChildIterator((ChildIterator *)&child_rc);
  return;
}

Assistant:

void ON_RenderContentPrivate::SetRenderContentNodeRecursive(const ON_RenderContent& rc, ON_XMLNode& node) // Static.
{
  // Copy the component name to the XML instance name.
  rc._private->SetPropertyValue(ON_RENDER_CONTENT_INSTANCE_NAME, rc.Name());

  // Copy the component id to the XML instance id.
  rc._private->SetPropertyValue(ON_RENDER_CONTENT_INSTANCE_ID, rc.Id());

  auto* child_node = new ON_XMLNode(rc.XMLNode());
  node.AttachChildNode(child_node);

  auto it = rc.GetChildIterator();
  ON_RenderContent* child_rc;
  while (nullptr != (child_rc = it.GetNextChild()))
  {
    SetRenderContentNodeRecursive(*child_rc, *child_node);
  }
}